

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

IVal * __thiscall
deqp::gls::BuiltinPrecisionTests::
ApplyVar<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_4,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
::doEvaluate(IVal *__return_storage_ptr__,
            ApplyVar<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_4,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
            *this,EvalContext *ctx)

{
  ApplyFunc *pAVar1;
  Variable<deqp::gls::BuiltinPrecisionTests::Void> *variable;
  Variable<deqp::gls::BuiltinPrecisionTests::Void> *variable_00;
  Variable<deqp::gls::BuiltinPrecisionTests::Void> *variable_01;
  
  pAVar1 = (this->
           super_Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_4,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
           ).m_func;
  variable = (Variable<deqp::gls::BuiltinPrecisionTests::Void> *)
             (this->
             super_Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_4,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
             ).m_args.b.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
             super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr;
  variable_00 = (Variable<deqp::gls::BuiltinPrecisionTests::Void> *)
                (this->
                super_Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_4,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
                ).m_args.c.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
                super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
                super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
                .m_ptr;
  variable_01 = (Variable<deqp::gls::BuiltinPrecisionTests::Void> *)
                (this->
                super_Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_4,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
                ).m_args.d.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
                super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
                super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
                .m_ptr;
  Environment::lookup<tcu::Matrix<float,4,3>>
            (ctx->env,(Variable<tcu::Matrix<float,_4,_3>_> *)
                      (this->
                      super_Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_4,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
                      ).m_args.a.super_ContainerExprPBase<tcu::Matrix<float,_4,_3>_>.
                      super_ExprPBase<tcu::Matrix<float,_4,_3>_>.
                      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_4,_3>_>_>
                      .m_ptr);
  Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>(ctx->env,variable);
  Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>(ctx->env,variable_00);
  Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>(ctx->env,variable_01);
  (**(code **)(*(long *)pAVar1 + 0x40))(__return_storage_ptr__,pAVar1,ctx);
  return __return_storage_ptr__;
}

Assistant:

IVal				doEvaluate		(const EvalContext& ctx) const
	{
		const Variable<Arg0>&	var0 = static_cast<const Variable<Arg0>&>(*this->m_args.a);
		const Variable<Arg1>&	var1 = static_cast<const Variable<Arg1>&>(*this->m_args.b);
		const Variable<Arg2>&	var2 = static_cast<const Variable<Arg2>&>(*this->m_args.c);
		const Variable<Arg3>&	var3 = static_cast<const Variable<Arg3>&>(*this->m_args.d);
		return this->m_func.apply(ctx,
								  ctx.env.lookup(var0), ctx.env.lookup(var1),
								  ctx.env.lookup(var2), ctx.env.lookup(var3));
	}